

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O2

void Abc_TruthGetParams(char *pFileName,int *pnVars,int *pnTruths)

{
  char cVar1;
  char *__ptr;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  
  if (pnVars != (int *)0x0) {
    *pnVars = 0;
  }
  if (pnTruths != (int *)0x0) {
    *pnTruths = 0;
  }
  __ptr = Abc_FileRead(pFileName);
  if (__ptr == (char *)0x0) {
    return;
  }
  for (uVar5 = 0; cVar1 = __ptr[uVar5], cVar1 != '\0'; uVar5 = uVar5 + 1) {
    if (((cVar1 == '\n') || (cVar1 == '\r')) || (cVar1 == ' ')) goto LAB_00277677;
  }
  puts("Strange, the input file does not have spaces and new-lines...");
LAB_00277677:
  cVar1 = *__ptr;
  uVar3 = uVar5;
  if ((cVar1 == '0') && (uVar3 = (ulong)((int)uVar5 - 2), __ptr[1] != 'x')) {
    uVar3 = uVar5 & 0xffffffff;
  }
  iVar2 = 0;
  do {
    if (iVar2 == 0x20) {
LAB_002776b2:
      puts("Does not look like the input file contains truth tables...");
      return;
    }
    if ((int)uVar3 << 2 == 1 << ((byte)iVar2 & 0x1f)) {
      if (0xfffffff0 < iVar2 - 0x11U) {
        if (pnVars != (int *)0x0) {
          *pnVars = iVar2;
        }
        iVar2 = 0;
        pcVar4 = __ptr;
        while (pcVar4 = pcVar4 + 1, cVar1 != '\0') {
          iVar2 = iVar2 + (uint)(cVar1 == '\n');
          cVar1 = *pcVar4;
        }
        if (pnTruths != (int *)0x0) {
          *pnTruths = iVar2;
        }
        free(__ptr);
        return;
      }
      goto LAB_002776b2;
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void Abc_TruthGetParams( char * pFileName, int * pnVars, int * pnTruths )
{
    char * pContents;
    int i, nVars, nLines;
    // prepare the output 
    if ( pnVars )
        *pnVars = 0;
    if ( pnTruths )
        *pnTruths = 0;
    // read data from file
    pContents = Abc_FileRead( pFileName );
    if ( pContents == NULL )
        return;
    // count the number of symbols before the first space or new-line
    // (note that on Windows symbols '\r' can be inserted before each '\n')
    for ( i = 0; pContents[i]; i++ )
        if ( pContents[i] == ' ' || pContents[i] == '\n' || pContents[i] == '\r' )
            break;
    if ( pContents[i] == 0 )
        printf( "Strange, the input file does not have spaces and new-lines...\n" );

    // acount for the fact that truth tables may have "0x" at the beginning of each line
    if ( pContents[0] == '0' && pContents[1] == 'x' )
        i = i - 2;

    // determine the number of variables
    for ( nVars = 0; nVars < 32; nVars++ )
        if ( 4 * i == (1 << nVars) ) // the number of bits equal to the size of truth table
            break;
    if ( nVars < 2 || nVars > 16 )
    {
        printf( "Does not look like the input file contains truth tables...\n" );
        return;
    }
    if ( pnVars )
        *pnVars = nVars;

    // determine the number of functions by counting the lines
    nLines = 0;
    for ( i = 0; pContents[i]; i++ )
        nLines += (pContents[i] == '\n');
    if ( pnTruths )
        *pnTruths = nLines;
    ABC_FREE( pContents );
}